

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  
  iVar7 = -1;
  if (end != ptr && -1 < (long)end - (long)ptr) {
    iVar7 = 0;
    if (*ptr == '-') {
      pbVar1 = (byte *)(ptr + 1);
      pcVar6 = end;
joined_r0x00487dc9:
      do {
        ptr = (char *)pbVar1;
        uVar5 = (long)end - (long)ptr;
        if ((long)uVar5 < 1) {
          return -1;
        }
        bVar4 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        if ((ulong)bVar4 < 9) {
          switch(bVar4) {
          case 2:
          case 3:
          case 4:
            goto switchD_00487df4_caseD_2;
          case 5:
            if (uVar5 == 1) {
              return -2;
            }
            iVar7 = (*enc[3].literalScanners[1])
                              (enc,ptr,pcVar6,
                               (char **)((long)&switchD_00487df4::switchdataD_0058e1b0 +
                                        (long)(int)(&switchD_00487df4::switchdataD_0058e1b0)[bVar4])
                              );
            if (iVar7 == 0) {
              pbVar1 = (byte *)ptr + 2;
              pcVar6 = extraout_RDX;
              goto joined_r0x00487dc9;
            }
            break;
          case 6:
            if (uVar5 < 3) {
              return -2;
            }
            iVar7 = (*enc[3].sameName)(enc,ptr,pcVar6);
            if (iVar7 == 0) {
              pbVar1 = (byte *)ptr + 3;
              pcVar6 = extraout_RDX_01;
              goto joined_r0x00487dc9;
            }
            break;
          case 7:
            if (uVar5 < 4) {
              return -2;
            }
            iVar7 = (*enc[3].nameMatchesAscii)
                              (enc,ptr,pcVar6,
                               (char *)((long)&switchD_00487df4::switchdataD_0058e1b0 +
                                       (long)(int)(&switchD_00487df4::switchdataD_0058e1b0)[bVar4]))
            ;
            if (iVar7 == 0) {
              pbVar1 = (byte *)ptr + 4;
              pcVar6 = extraout_RDX_00;
              goto joined_r0x00487dc9;
            }
          }
          iVar7 = 0;
          goto LAB_00487e8b;
        }
        if (bVar4 != 0x1b) {
switchD_00487df4_caseD_2:
          pbVar1 = (byte *)ptr + 1;
          goto joined_r0x00487dc9;
        }
        pbVar1 = (byte *)ptr + 1;
        if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
          return -1;
        }
      } while (*pbVar1 != 0x2d);
      pbVar1 = (byte *)ptr + 2;
      if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
        return -1;
      }
      pbVar2 = (byte *)ptr + 3;
      pbVar3 = (byte *)ptr + 2;
      ptr = (char *)pbVar1;
      if (*pbVar3 == 0x3e) {
        ptr = (char *)pbVar2;
      }
      iVar7 = 0xd;
      if (*pbVar3 != 0x3e) {
        iVar7 = 0;
      }
    }
LAB_00487e8b:
    *nextTokPtr = ptr;
  }
  return iVar7;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr,
                    const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}